

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

int ParseFile_BuildDb(TCascStorage *hs,void *pvListFile)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  TCHAR *pTVar4;
  int iVar5;
  QUERY_KEY TagString;
  CASC_CSV Csv;
  QUERY_KEY local_248;
  CASC_CSV local_238;
  
  local_248.pbData = (LPBYTE)0x0;
  local_248.cbData = 0;
  CASC_CSV::CASC_CSV(&local_238);
  sVar3 = CASC_CSV::LoadNextLine(&local_238,pvListFile);
  iVar5 = 1000;
  iVar1 = iVar5;
  if (sVar3 != 0) {
    iVar1 = CASC_CSV::GetData(&local_238,&hs->CdnBuildKey,0,true);
    if (iVar1 == 0) {
      iVar1 = CASC_CSV::GetData(&local_238,&hs->CdnConfigKey,1,true);
      if (iVar1 == 0) {
        iVar2 = CASC_CSV::GetData(&local_238,&local_248,2,false);
        if ((iVar2 == 0) && (local_248.pbData != (LPBYTE)0x0)) {
          GetDefaultLocaleMask(hs,&local_248);
          FreeCascBlob(&local_248);
        }
        pTVar4 = CASC_CSV::GetString(&local_238,3);
        hs->szCdnList = pTVar4;
        if (pTVar4 == (TCHAR *)0x0) {
          iVar1 = 0xc;
        }
        else {
          iVar1 = iVar5;
          if (((hs->CdnBuildKey).pbData != (LPBYTE)0x0) &&
             ((hs->CdnConfigKey).pbData != (LPBYTE)0x0)) {
            iVar1 = iVar2;
          }
        }
      }
    }
  }
  CASC_CSV::~CASC_CSV(&local_238);
  return iVar1;
}

Assistant:

static int ParseFile_BuildDb(TCascStorage * hs, void * pvListFile)
{
    QUERY_KEY TagString = {NULL, 0};
    CASC_CSV Csv;
    int nError;

    // Load the single line from the text file
    if(Csv.LoadNextLine(pvListFile) == 0)
        return ERROR_BAD_FORMAT;

    // Extract the CDN build key
    nError = Csv.GetData(hs->CdnBuildKey, 0, true);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Load the CDN config key
    nError = Csv.GetData(hs->CdnConfigKey, 1, true);
    if (nError != ERROR_SUCCESS)
        return nError;

    // Load the the tags
    nError = Csv.GetData(TagString, 2, false);
    if (nError == ERROR_SUCCESS && TagString.pbData != NULL)
    {
        GetDefaultLocaleMask(hs, &TagString);
        FreeCascBlob(&TagString);
    }

    // Load the URL
    hs->szCdnList = Csv.GetString(3);
    if (hs->szCdnList == NULL)
        return ERROR_NOT_ENOUGH_MEMORY;

    // Verify all variables
    if (hs->CdnBuildKey.pbData == NULL || hs->CdnConfigKey.pbData == NULL)
        nError = ERROR_BAD_FORMAT;
    return nError;
}